

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O1

int xmlSchemaComparePreserveCollapseStrings(xmlChar *x,xmlChar *y,int invert)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  ulong uVar4;
  bool bVar5;
  
  while (((ulong)*y < 0x21 && ((0x100002600U >> ((ulong)*y & 0x3f) & 1) != 0))) {
    y = y + 1;
  }
  bVar3 = *x;
  while (bVar3 != 0) {
    bVar2 = *y;
    uVar4 = (ulong)bVar2;
    if (uVar4 < 0x21) {
      if ((0x100002600U >> (uVar4 & 0x3f) & 1) == 0) {
        if (uVar4 != 0) goto LAB_001d117d;
        if (bVar3 == 0) break;
      }
      else {
        if (bVar3 == 0x20) {
          do {
            y = y + 1;
            if (0x20 < (ulong)*y) break;
          } while ((0x100002600U >> ((ulong)*y & 0x3f) & 1) != 0);
          goto LAB_001d1187;
        }
        if (bVar3 < 0x20) goto LAB_001d11ba;
      }
LAB_001d11c1:
      bVar5 = invert != 0;
      goto LAB_001d11c5;
    }
LAB_001d117d:
    if (bVar3 < bVar2) goto LAB_001d11ba;
    if (bVar3 != bVar2) goto LAB_001d11c1;
    y = y + 1;
LAB_001d1187:
    pbVar1 = x + 1;
    x = x + 1;
    bVar3 = *pbVar1;
  }
  if (*y == 0) {
    return 0;
  }
  do {
    uVar4 = (ulong)*y;
    if (0x20 < uVar4) {
LAB_001d11ba:
      bVar5 = invert == 0;
LAB_001d11c5:
      return -(uint)bVar5 | 1;
    }
    if ((0x100002600U >> (uVar4 & 0x3f) & 1) == 0) {
      if (uVar4 == 0) {
        return 0;
      }
      goto LAB_001d11ba;
    }
    y = y + 1;
  } while( true );
}

Assistant:

static int
xmlSchemaComparePreserveCollapseStrings(const xmlChar *x,
				        const xmlChar *y,
					int invert)
{
    int tmp;

    /*
    * Skip leading blank chars of the collapsed string.
    */
    while IS_WSP_BLANK_CH(*y)
	y++;

    while ((*x != 0) && (*y != 0)) {
	if IS_WSP_BLANK_CH(*y) {
	    if (! IS_WSP_SPACE_CH(*x)) {
		/*
		* The yv character would have been replaced to 0x20.
		*/
		if ((*x - 0x20) < 0) {
		    if (invert)
			return(1);
		    else
			return(-1);
		} else {
		    if (invert)
			return(-1);
		    else
			return(1);
		}
	    }
	    x++;
	    y++;
	    /*
	    * Skip contiguous blank chars of the collapsed string.
	    */
	    while IS_WSP_BLANK_CH(*y)
		y++;
	} else {
	    tmp = *x++ - *y++;
	    if (tmp < 0) {
		if (invert)
		    return(1);
		else
		    return(-1);
	    }
	    if (tmp > 0) {
		if (invert)
		    return(-1);
		else
		    return(1);
	    }
	}
    }